

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

_Bool patch_reloc(tcg_insn_unit *code_ptr,int type,intptr_t value,intptr_t addend)

{
  tcg_insn_unit tVar1;
  long lVar2;
  
  lVar2 = value + addend;
  if (type != 1) {
    if (type == 0x17) {
      tVar1 = (tcg_insn_unit)(lVar2 - (long)code_ptr);
      if ((long)(char)tVar1 == lVar2 - (long)code_ptr) {
        *code_ptr = tVar1;
        return true;
      }
      return false;
    }
    if (type != 2) {
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
              ,0xc5);
      abort();
    }
    lVar2 = lVar2 - (long)code_ptr;
    if ((int)lVar2 != lVar2) {
      return false;
    }
  }
  *(int *)code_ptr = (int)lVar2;
  return true;
}

Assistant:

static bool patch_reloc(tcg_insn_unit *code_ptr, int type,
                        intptr_t value, intptr_t addend)
{
    value += addend;
    switch(type) {
    case R_386_PC32:
        value -= (uintptr_t)code_ptr;
        if (value != (int32_t)value) {
            return false;
        }
        /* FALLTHRU */
    case R_386_32:
        tcg_patch32(code_ptr, value);
        break;
    case R_386_PC8:
        value -= (uintptr_t)code_ptr;
        if (value != (int8_t)value) {
            return false;
        }
        tcg_patch8(code_ptr, value);
        break;
    default:
        tcg_abort();
    }
    return true;
}